

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O2

void __thiscall
Rml::DecoratorLinearGradient::ReleaseElementData
          (DecoratorLinearGradient *this,DecoratorDataHandle handle)

{
  Pool<Rml::ShaderElementData> *this_00;
  
  this_00 = GetShaderElementDataPool();
  Pool<Rml::ShaderElementData>::DestroyAndDeallocate(this_00,(ShaderElementData *)handle);
  return;
}

Assistant:

void DecoratorLinearGradient::ReleaseElementData(DecoratorDataHandle handle) const
{
	ShaderElementData* element_data = reinterpret_cast<ShaderElementData*>(handle);
	GetShaderElementDataPool().DestroyAndDeallocate(element_data);
}